

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
           *this,ID_index cellIndex,
          initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary,Dimension dim)

{
  uint uVar1;
  Index IVar2;
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  *this_00;
  node_ptr plVar3;
  ulong uVar4;
  Delete_disposer local_78;
  Index local_6c;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>
  local_68;
  
  if (dim == -1) {
    if (boundary->_M_len == 0) {
      dim = 0;
    }
    else {
      dim = (int)boundary->_M_len - 1;
    }
  }
  if (boundary->_M_len != 0) {
    uVar1 = boundary->_M_array[boundary->_M_len - 1].first;
    this_00 = *(vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
                **)(this + 0x20);
    uVar4 = ((long)(this_00->
                   super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->
                   super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    if (uVar4 < uVar1 || uVar4 - uVar1 == 0) {
      std::
      vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
      ::resize(this_00,(ulong)(uVar1 + 1));
    }
  }
  local_6c = *(Index *)(this + 0x60);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
  ::
  Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>>>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
              *)&local_68,local_6c,boundary,dim,
             *(vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
               **)(this + 0x20),*(Column_settings **)(this + 0x68));
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0x28),(const_iterator)0x0,&local_6c,&local_68);
  local_78.col_ = &local_68;
  while (local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
         (node_ptr)&local_68.column_) {
    plVar3 = (local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_)->next_;
    (local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_)->next_ =
         (node_ptr)0x0;
    (local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_)->prev_ =
         (node_ptr)0x0;
    Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>
    ::Delete_disposer::operator()
              (&local_78,
               (Entry *)&local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_
                         [-1].prev_);
    local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = plVar3;
  }
  local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  local_68.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,dim);
  IVar2 = *(Index *)(this + 0x60);
  *(Index *)(this + 0x60) = IVar2 + 1;
  return IVar2;
}

Assistant:

inline typename Boundary_matrix<Master_matrix>::Index Boundary_matrix<Master_matrix>::insert_boundary(
    ID_index cellIndex, const Boundary_range& boundary, Dimension dim)
{
  if (dim == Master_matrix::template get_null_value<Dimension>()) dim = boundary.size() == 0 ? 0 : boundary.size() - 1;

  _orderRowsIfNecessary();

  //updates container sizes
  if constexpr (Master_matrix::Option_list::has_row_access && !Master_matrix::Option_list::has_removable_rows) {
    if (boundary.size() != 0){
      ID_index pivot;
      if constexpr (Master_matrix::Option_list::is_z2) {
        pivot = *std::prev(boundary.end());
      } else {
        pivot = std::prev(boundary.end())->first;
      }
      //row container
      if (RA_opt::rows_->size() <= pivot) RA_opt::rows_->resize(pivot + 1);
    }
  }

  //row swap map containers
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (activeSwapOption) {
      Swap_opt::indexToRow_.emplace(cellIndex, cellIndex);
      Swap_opt::rowToIndex_.emplace(cellIndex, cellIndex);
    }
  } else {
    if constexpr (activeSwapOption) {
      for (Index i = Swap_opt::indexToRow_.size(); i <= cellIndex; ++i) {
        Swap_opt::indexToRow_.push_back(i);
        Swap_opt::rowToIndex_.push_back(i);
      }
    }
  }

  //maps for possible shifting between column content and position indices used for birth events
  if constexpr (activePairingOption){
    if (cellIndex != nextInsertIndex_){
      Pair_opt::idToPosition_.emplace(cellIndex, nextInsertIndex_);
      if constexpr (Master_matrix::Option_list::has_removable_columns){
        Pair_opt::PIDM::map_.emplace(nextInsertIndex_, cellIndex);
      }
    }
  }

  _container_insert(boundary, nextInsertIndex_, dim);

  return nextInsertIndex_++;
}